

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.h
# Opt level: O3

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestMemCheckCommand::Clone(cmCTestMemCheckCommand *this)

{
  _func_int *p_Var1;
  _func_int **__s;
  long in_RSI;
  
  __s = (_func_int **)operator_new(0x3a0);
  memset(__s,0,0x3a0);
  __s[0x17] = (_func_int *)(__s + 0x19);
  __s[0x1b] = (_func_int *)(__s + 0x1d);
  __s[0x1f] = (_func_int *)(__s + 0x21);
  __s[0x23] = (_func_int *)(__s + 0x25);
  __s[0x27] = (_func_int *)(__s + 0x29);
  __s[0x2b] = (_func_int *)(__s + 0x2d);
  __s[0x2f] = (_func_int *)(__s + 0x31);
  __s[0x33] = (_func_int *)(__s + 0x35);
  __s[0x37] = (_func_int *)(__s + 0x39);
  __s[0x3b] = (_func_int *)(__s + 0x3d);
  __s[0x3f] = (_func_int *)(__s + 0x41);
  __s[0x43] = (_func_int *)(__s + 0x45);
  __s[0x47] = (_func_int *)(__s + 0x49);
  __s[0x4b] = (_func_int *)(__s + 0x4d);
  __s[0x4f] = (_func_int *)(__s + 0x51);
  __s[0x53] = (_func_int *)(__s + 0x55);
  __s[0x57] = (_func_int *)(__s + 0x59);
  __s[0x5b] = (_func_int *)(__s + 0x5d);
  __s[0x5f] = (_func_int *)(__s + 0x61);
  __s[99] = (_func_int *)(__s + 0x65);
  __s[0x67] = (_func_int *)(__s + 0x69);
  __s[0x6b] = (_func_int *)(__s + 0x6d);
  *__s = (_func_int *)&PTR__cmCTestMemCheckCommand_0094b2f0;
  __s[0x70] = (_func_int *)(__s + 0x72);
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  __s[3] = *(_func_int **)(in_RSI + 0x18);
  __s[4] = p_Var1;
  (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.super_cmCommand.
  _vptr_cmCommand = __s;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestMemCheckCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }